

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

InnerProductLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(NeuralNetworkLayer *this)

{
  ulong uVar1;
  InnerProductLayerParams *pIVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x8c) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x8c;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pIVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(arena);
    (this->layer_).innerproduct_ = pIVar2;
  }
  return (InnerProductLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::InnerProductLayerParams* NeuralNetworkLayer::_internal_mutable_innerproduct() {
  if (!_internal_has_innerproduct()) {
    clear_layer();
    set_has_innerproduct();
    layer_.innerproduct_ = CreateMaybeMessage< ::CoreML::Specification::InnerProductLayerParams >(GetArenaForAllocation());
  }
  return layer_.innerproduct_;
}